

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O1

int LS_Thing_Deactivate(line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,
                       int arg4)

{
  AActor *pAVar1;
  uint uVar2;
  AActor *pAVar3;
  AActor *pAVar4;
  
  if (arg0 == 0) {
    if (it == (AActor *)0x0) {
      uVar2 = 0;
    }
    else {
      uVar2 = it->activationtype;
      if ((uVar2 >> 9 & 1) != 0) {
        it->activationtype = uVar2 & 0xfffffdff;
        if ((uVar2 >> 10 & 1) != 0) {
          it->activationtype = uVar2 & 0xfffffdff | 0x100;
        }
      }
      (*(it->super_DThinker).super_DObject._vptr_DObject[0xe])(it,it);
      uVar2 = 1;
    }
  }
  else {
    for (pAVar3 = AActor::TIDHash[arg0 & 0x7f];
        (pAVar1 = pAVar3, pAVar3 != (AActor *)0x0 && (pAVar3->tid != arg0)); pAVar3 = pAVar3->inext)
    {
    }
    while (pAVar4 = pAVar1, pAVar1 != (AActor *)0x0) {
      do {
        pAVar4 = pAVar4->inext;
        if (pAVar4 == (AActor *)0x0) break;
      } while (pAVar4->tid != arg0);
      uVar2 = pAVar1->activationtype;
      if ((uVar2 >> 9 & 1) != 0) {
        pAVar1->activationtype = uVar2 & 0xfffffdff;
        if ((uVar2 >> 10 & 1) != 0) {
          pAVar1->activationtype = uVar2 & 0xfffffdff | 0x100;
        }
      }
      (*(pAVar1->super_DThinker).super_DObject._vptr_DObject[0xe])(pAVar1,it);
      pAVar1 = pAVar4;
    }
    uVar2 = (uint)(pAVar3 != (AActor *)0x0);
  }
  return uVar2;
}

Assistant:

FUNC(LS_Thing_Deactivate)
// Thing_Deactivate (tid)
{
	if (arg0 != 0)
	{
		AActor *actor;
		FActorIterator iterator (arg0);
		int count = 0;
	
		actor = iterator.Next ();
		while (actor)
		{
			// Actor might removes itself as part of deactivation, so get next
			// one before we activate it.
			AActor *temp = iterator.Next ();
			DoDeactivateThing(actor, it);
			actor = temp;
			count++;
		}
	
		return count != 0;
	}
	else if (it != NULL)
	{
		DoDeactivateThing(it, it);
		return true;
	}
	return false;
}